

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_view_unittest.cpp
# Opt level: O0

void __thiscall
array_view_const_members_Test::~array_view_const_members_Test(array_view_const_members_Test *this)

{
  array_view_const_members_Test *this_local;
  
  ~array_view_const_members_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(array_view, const_members) {
    {
        A a(10);
        auto view1 = a.const_data();
        auto view2 = a.const_data_view();
    }

    {
        const A a(10);
        auto view1 = a.const_data();
        auto view2 = a.const_data_view();
    }
}